

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O0

void __thiscall script_tests::script_standard_push::test_method(script_standard_push *this)

{
  span<const_unsigned_char,_18446744073709551615UL> b;
  bool bVar1;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  uint i_1;
  int i;
  ScriptError err;
  CScript script_1;
  CScript script;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa48;
  undefined7 in_stack_fffffffffffffa50;
  undefined1 in_stack_fffffffffffffa57;
  assertion_result *in_stack_fffffffffffffa58;
  undefined7 in_stack_fffffffffffffa60;
  undefined1 in_stack_fffffffffffffa67;
  lazy_ostream *in_stack_fffffffffffffa68;
  const_string *in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa78;
  opcodetype in_stack_fffffffffffffa7c;
  lazy_ostream *in_stack_fffffffffffffa80;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffa88;
  lazy_ostream *in_stack_fffffffffffffaf0;
  const_string *in_stack_fffffffffffffaf8;
  uint in_stack_fffffffffffffb04;
  lazy_ostream *in_stack_fffffffffffffb08;
  CScript *in_stack_fffffffffffffb10;
  undefined7 in_stack_fffffffffffffb18;
  undefined1 in_stack_fffffffffffffb1f;
  lazy_ostream local_478 [2];
  assertion_result local_458 [2];
  ScriptError in_stack_fffffffffffffc1c;
  lazy_ostream local_3d0 [2];
  unit_test_log_t local_3b0;
  assertion_result local_3a8 [2];
  const_string local_370 [5];
  lazy_ostream local_320 [2];
  assertion_result local_300 [3];
  undefined1 local_2b1;
  uint local_294;
  const_string local_290;
  lazy_ostream local_280 [2];
  assertion_result local_260 [2];
  const_string local_228 [5];
  lazy_ostream local_1d8 [2];
  undefined1 local_1b8 [64];
  const_string local_178 [5];
  lazy_ostream local_128 [2];
  assertion_result local_108 [2];
  int local_d0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_d0 = 0; local_d0 < 67000; local_d0 = local_d0 + 1) {
    CScript::CScript((CScript *)in_stack_fffffffffffffa48);
    CScript::operator<<((CScript *)in_stack_fffffffffffffa58,
                        CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50));
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa58,
                 (pointer)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (unsigned_long)in_stack_fffffffffffffa48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffa88._M_extent_value,
                 (const_string *)in_stack_fffffffffffffa80,
                 CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                 in_stack_fffffffffffffa70);
      CScript::IsPushOnly((CScript *)in_stack_fffffffffffffa58);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffffa58,(bool)in_stack_fffffffffffffa57);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (char (*) [8])in_stack_fffffffffffffa48);
      boost::unit_test::operator<<
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]> *)
                 CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (int *)in_stack_fffffffffffffa48);
      boost::unit_test::operator<<
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>,_int,_const_int_&>
                  *)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (char (*) [19])in_stack_fffffffffffffa48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa58,
                 (pointer)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (unsigned_long)in_stack_fffffffffffffa48);
      in_stack_fffffffffffffa48 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_108,local_128,local_178,0x517,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>,_int,_const_int_&>,_char[19],_const_char_(&)[19]>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>,_int,_const_int_&>,_char[19],_const_char_(&)[19]>
                  *)in_stack_fffffffffffffa48);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>,_int,_const_int_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>,_int,_const_int_&>
                  *)in_stack_fffffffffffffa48);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>
                          *)in_stack_fffffffffffffa48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffa48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa58,
                 (pointer)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (unsigned_long)in_stack_fffffffffffffa48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffa88._M_extent_value,
                 (const_string *)in_stack_fffffffffffffa80,
                 CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                 in_stack_fffffffffffffa70);
      local_38 = 0;
      uStack_30 = 0;
      local_48 = 0;
      uStack_40 = 0;
      CScript::CScript((CScript *)in_stack_fffffffffffffa48);
      CScript::operator<<((CScript *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
      local_1b8._0_8_ = (char *)0x0;
      in_stack_fffffffffffffb10 = (CScript *)local_1b8;
      BaseSignatureChecker::BaseSignatureChecker((BaseSignatureChecker *)in_stack_fffffffffffffa48);
      in_stack_fffffffffffffb1f =
           VerifyScript((CScript *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18),
                        in_stack_fffffffffffffb10,(CScriptWitness *)in_stack_fffffffffffffb08,
                        in_stack_fffffffffffffb04,(BaseSignatureChecker *)in_stack_fffffffffffffaf8,
                        (ScriptError *)in_stack_fffffffffffffaf0);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffffa58,(bool)in_stack_fffffffffffffa57);
      in_stack_fffffffffffffb08 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (char (*) [8])in_stack_fffffffffffffa48);
      boost::unit_test::operator<<
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]> *)
                 CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (int *)in_stack_fffffffffffffa48);
      boost::unit_test::operator<<
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>,_int,_const_int_&>
                  *)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (char (*) [27])in_stack_fffffffffffffa48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa58,
                 (pointer)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (unsigned_long)in_stack_fffffffffffffa48);
      in_stack_fffffffffffffa48 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)(local_1b8 + 8),local_1d8,local_228,0x518,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>,_int,_const_int_&>,_char[27],_const_char_(&)[27]>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>,_int,_const_int_&>,_char[27],_const_char_(&)[27]>
                  *)in_stack_fffffffffffffa48);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>,_int,_const_int_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>,_int,_const_int_&>
                  *)in_stack_fffffffffffffa48);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>
                          *)in_stack_fffffffffffffa48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffa48);
      BaseSignatureChecker::~BaseSignatureChecker((BaseSignatureChecker *)in_stack_fffffffffffffa48)
      ;
      CScript::~CScript((CScript *)in_stack_fffffffffffffa48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
      in_stack_fffffffffffffb04 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb04);
    } while (bVar1);
    do {
      in_stack_fffffffffffffaf8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa58,
                 (pointer)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (unsigned_long)in_stack_fffffffffffffa48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffa88._M_extent_value,
                 (const_string *)in_stack_fffffffffffffa80,
                 CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                 in_stack_fffffffffffffa70);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffffa58,(bool)in_stack_fffffffffffffa57);
      in_stack_fffffffffffffaf0 = boost::unit_test::lazy_ostream::instance();
      ScriptErrorString_abi_cxx11_(in_stack_fffffffffffffc1c);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa58,
                 (pointer)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (unsigned_long)in_stack_fffffffffffffa48);
      in_stack_fffffffffffffa48 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_260,local_280,&local_290,0x519,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_fffffffffffffa48);
      std::__cxx11::string::~string(in_stack_fffffffffffffa48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffa48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    CScript::~CScript((CScript *)in_stack_fffffffffffffa48);
  }
  for (local_294 = 0; local_294 < 0x209; local_294 = local_294 + 1) {
    local_2b1 = 0x49;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffa48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
               (size_type)in_stack_fffffffffffffa70,
               (value_type_conflict3 *)in_stack_fffffffffffffa68,
               (allocator_type *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffa48)
    ;
    CScript::CScript((CScript *)in_stack_fffffffffffffa48);
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
              ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffa58,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50));
    b._M_extent._M_extent_value = in_stack_fffffffffffffa88._M_extent_value;
    b._M_ptr = (pointer)in_stack_fffffffffffffa80;
    CScript::operator<<((CScript *)in_stack_fffffffffffffa68,b);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa58,
                 (pointer)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (unsigned_long)in_stack_fffffffffffffa48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffa88._M_extent_value,
                 (const_string *)in_stack_fffffffffffffa80,
                 CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                 in_stack_fffffffffffffa70);
      CScript::IsPushOnly((CScript *)in_stack_fffffffffffffa58);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffffa58,(bool)in_stack_fffffffffffffa57);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (char (*) [8])in_stack_fffffffffffffa48);
      boost::unit_test::operator<<
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]> *)
                 CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (uint *)in_stack_fffffffffffffa48);
      boost::unit_test::operator<<
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>,_unsigned_int,_const_unsigned_int_&>
                  *)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (char (*) [19])in_stack_fffffffffffffa48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa58,
                 (pointer)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (unsigned_long)in_stack_fffffffffffffa48);
      in_stack_fffffffffffffa48 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_300,local_320,local_370,0x520,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>,_unsigned_int,_const_unsigned_int_&>,_char[19],_const_char_(&)[19]>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>,_unsigned_int,_const_unsigned_int_&>,_char[19],_const_char_(&)[19]>
                  *)in_stack_fffffffffffffa48);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>,_unsigned_int,_const_unsigned_int_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>,_unsigned_int,_const_unsigned_int_&>
                  *)in_stack_fffffffffffffa48);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>
                          *)in_stack_fffffffffffffa48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffa48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa58,
                 (pointer)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (unsigned_long)in_stack_fffffffffffffa48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffa88._M_extent_value,
                 (const_string *)in_stack_fffffffffffffa80,
                 CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                 in_stack_fffffffffffffa70);
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      CScript::CScript((CScript *)in_stack_fffffffffffffa48);
      CScript::operator<<((CScript *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
      local_3b0.super_test_observer._vptr_test_observer = (test_observer)(_func_int **)0x0;
      in_stack_fffffffffffffa88._M_extent_value = (size_t)&local_3b0;
      BaseSignatureChecker::BaseSignatureChecker((BaseSignatureChecker *)in_stack_fffffffffffffa48);
      VerifyScript((CScript *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18),
                   in_stack_fffffffffffffb10,(CScriptWitness *)in_stack_fffffffffffffb08,
                   in_stack_fffffffffffffb04,(BaseSignatureChecker *)in_stack_fffffffffffffaf8,
                   (ScriptError *)in_stack_fffffffffffffaf0);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffffa58,(bool)in_stack_fffffffffffffa57);
      in_stack_fffffffffffffa80 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (char (*) [8])in_stack_fffffffffffffa48);
      boost::unit_test::operator<<
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]> *)
                 CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (uint *)in_stack_fffffffffffffa48);
      boost::unit_test::operator<<
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>,_unsigned_int,_const_unsigned_int_&>
                  *)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (char (*) [27])in_stack_fffffffffffffa48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa58,
                 (pointer)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (unsigned_long)in_stack_fffffffffffffa48);
      in_stack_fffffffffffffa48 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_3a8,local_3d0,(const_string *)&stack0xfffffffffffffbe0,0x521,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>,_unsigned_int,_const_unsigned_int_&>,_char[27],_const_char_(&)[27]>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>,_unsigned_int,_const_unsigned_int_&>,_char[27],_const_char_(&)[27]>
                  *)in_stack_fffffffffffffa48);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>,_unsigned_int,_const_unsigned_int_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>,_unsigned_int,_const_unsigned_int_&>
                  *)in_stack_fffffffffffffa48);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[8],_const_char_(&)[8]>
                          *)in_stack_fffffffffffffa48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffa48);
      BaseSignatureChecker::~BaseSignatureChecker((BaseSignatureChecker *)in_stack_fffffffffffffa48)
      ;
      CScript::~CScript((CScript *)in_stack_fffffffffffffa48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
      in_stack_fffffffffffffa7c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa7c);
    } while (bVar1);
    do {
      in_stack_fffffffffffffa70 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa58,
                 (pointer)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (unsigned_long)in_stack_fffffffffffffa48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffa88._M_extent_value,
                 (const_string *)in_stack_fffffffffffffa80,
                 CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                 in_stack_fffffffffffffa70);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffffa58,(bool)in_stack_fffffffffffffa57);
      in_stack_fffffffffffffa68 = boost::unit_test::lazy_ostream::instance();
      ScriptErrorString_abi_cxx11_(in_stack_fffffffffffffc1c);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa58,
                 (pointer)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 (unsigned_long)in_stack_fffffffffffffa48);
      in_stack_fffffffffffffa48 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_458,local_478,(const_string *)&stack0xfffffffffffffb78,0x522,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_fffffffffffffa48);
      std::__cxx11::string::~string(in_stack_fffffffffffffa48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffa48);
      in_stack_fffffffffffffa67 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffa67);
    CScript::~CScript((CScript *)in_stack_fffffffffffffa48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(script_standard_push)
{
    ScriptError err;
    for (int i=0; i<67000; i++) {
        CScript script;
        script << i;
        BOOST_CHECK_MESSAGE(script.IsPushOnly(), "Number " << i << " is not pure push.");
        BOOST_CHECK_MESSAGE(VerifyScript(script, CScript() << OP_1, nullptr, SCRIPT_VERIFY_MINIMALDATA, BaseSignatureChecker(), &err), "Number " << i << " push is not minimal data.");
        BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));
    }

    for (unsigned int i=0; i<=MAX_SCRIPT_ELEMENT_SIZE; i++) {
        std::vector<unsigned char> data(i, '\111');
        CScript script;
        script << data;
        BOOST_CHECK_MESSAGE(script.IsPushOnly(), "Length " << i << " is not pure push.");
        BOOST_CHECK_MESSAGE(VerifyScript(script, CScript() << OP_1, nullptr, SCRIPT_VERIFY_MINIMALDATA, BaseSignatureChecker(), &err), "Length " << i << " push is not minimal data.");
        BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));
    }
}